

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::UncompressedFunctions::Compress(CompressionState *state_p,Vector *data,idx_t count)

{
  CompressionState *this;
  idx_t iVar1;
  __int_type _Var2;
  pointer pCVar3;
  idx_t iVar4;
  idx_t segment_size;
  idx_t offset;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(data,count,&local_78);
  this = state_p + 2;
  offset = 0;
  while (count != 0) {
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)this);
    iVar4 = ColumnSegment::Append
                      (pCVar3,(ColumnAppendState *)&state_p[2].info,&local_78,offset,count);
    count = count - iVar4;
    if (count == 0) break;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)this);
    iVar1 = (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)this);
    _Var2 = (pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)this);
    segment_size = ColumnSegment::FinalizeAppend(pCVar3,(ColumnAppendState *)&state_p[2].info);
    UncompressedCompressState::FlushSegment((UncompressedCompressState *)state_p,segment_size);
    (*state_p->_vptr_CompressionState[2])(state_p,_Var2 + iVar1);
    offset = offset + iVar4;
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

void UncompressedFunctions::Compress(CompressionState &state_p, Vector &data, idx_t count) {
	auto &state = state_p.Cast<UncompressedCompressState>();
	UnifiedVectorFormat vdata;
	data.ToUnifiedFormat(count, vdata);

	idx_t offset = 0;
	while (count > 0) {
		idx_t appended = state.current_segment->Append(state.append_state, vdata, offset, count);
		if (appended == count) {
			// appended everything: finished
			return;
		}
		auto next_start = state.current_segment->start + state.current_segment->count;
		// the segment is full: flush it to disk
		state.FlushSegment(state.current_segment->FinalizeAppend(state.append_state));

		// now create a new segment and continue appending
		state.CreateEmptySegment(next_start);
		offset += appended;
		count -= appended;
	}
}